

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

uint32_t bitset_container_rank_many
                   (bitset_container_t *container,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *in_RCX;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  uint64_t mask;
  uint64_t lastpos;
  uint64_t lastword;
  int count;
  uint16_t xlow;
  uint16_t xhigh;
  uint32_t x;
  uint32_t *iter;
  int sum;
  int i;
  uint16_t high;
  uint *local_48;
  int local_3c;
  int local_38;
  long *local_30;
  
  uVar1 = *in_RDX;
  local_38 = 0;
  local_3c = 0;
  local_48 = in_RDX;
  local_30 = in_R8;
  while( true ) {
    if (local_48 == in_RCX) {
      return (uint32_t)((long)local_48 - (long)in_RDX >> 2);
    }
    uVar2 = *local_48;
    if ((short)(uVar2 >> 0x10) != (short)(uVar1 >> 0x10)) break;
    for (; local_38 < (int)((uVar2 & 0xffff) / 0x40); local_38 = local_38 + 1) {
      iVar3 = roaring_hamming(*(uint64_t *)(*(long *)(in_RDI + 8) + (long)local_38 * 8));
      local_3c = iVar3 + local_3c;
    }
    iVar3 = roaring_hamming(*(ulong *)(*(long *)(in_RDI + 8) + (long)local_38 * 8) &
                            (1L << (sbyte)((ulong)(ushort)uVar2 % 0x40)) * 2 - 1U);
    *local_30 = in_RSI + local_3c + (long)iVar3;
    local_48 = local_48 + 1;
    local_30 = local_30 + 1;
  }
  return (uint32_t)((long)local_48 - (long)in_RDX >> 2);
}

Assistant:

uint32_t bitset_container_rank_many(const bitset_container_t *container, uint64_t start_rank, const uint32_t* begin, const uint32_t* end, uint64_t* ans){
  const uint16_t high = (uint16_t)((*begin) >> 16);
  int i = 0;
  int sum = 0;
  const uint32_t* iter = begin;
  for(; iter != end; iter++) {
      uint32_t x = *iter;
      uint16_t xhigh = (uint16_t)(x >> 16);
      if(xhigh != high) return iter - begin; // stop at next container

      uint16_t xlow = (uint16_t)x;
      for(int count = xlow / 64; i < count; i++){
        sum += roaring_hamming(container->words[i]);
      }
      uint64_t lastword = container->words[i];
      uint64_t lastpos = UINT64_C(1) << (xlow % 64);
      uint64_t mask = lastpos + lastpos - 1; // smear right
      *(ans++) = start_rank + sum + roaring_hamming(lastword & mask);
  }
  return iter - begin;
}